

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qplaintextedit.cpp
# Opt level: O3

int __thiscall
QPlainTextDocumentLayout::qt_metacall(QPlainTextDocumentLayout *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_register_00000014;
  
  iVar1 = QAbstractTextDocumentLayout::qt_metacall
                    ((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < iVar1) {
    switch(_c) {
    case ReadProperty:
      if (iVar1 == 0) {
        *(undefined4 *)*_a = *(undefined4 *)(*(long *)&this->field_0x8 + 0xbc);
      }
      break;
    case WriteProperty:
      if (iVar1 == 0) {
        *(undefined4 *)(*(long *)&this->field_0x8 + 0xbc) = **_a;
      }
      break;
    case ResetProperty:
    case RegisterPropertyMetaType:
    case BindableProperty:
      break;
    default:
      goto switchD_0049ccec_caseD_4;
    }
    iVar1 = iVar1 + -1;
  }
switchD_0049ccec_caseD_4:
  return iVar1;
}

Assistant:

int QPlainTextDocumentLayout::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractTextDocumentLayout::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    return _id;
}